

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# self_test_core.c
# Opt level: O0

int OSSL_SELF_TEST_oncorrupt_byte(OSSL_SELF_TEST *st,uchar *bytes)

{
  int iVar1;
  byte *in_RSI;
  undefined8 *in_RDI;
  OSSL_SELF_TEST *in_stack_000000b0;
  
  if ((in_RDI != (undefined8 *)0x0) && (in_RDI[3] != 0)) {
    *in_RDI = "Corrupt";
    self_test_setparams(in_stack_000000b0);
    iVar1 = (*(code *)in_RDI[3])(in_RDI + 4,in_RDI[0x18]);
    if (iVar1 == 0) {
      *in_RSI = *in_RSI ^ 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

int OSSL_SELF_TEST_oncorrupt_byte(OSSL_SELF_TEST *st, unsigned char *bytes)
{
    if (st != NULL && st->cb != NULL) {
        st->phase = OSSL_SELF_TEST_PHASE_CORRUPT;
        self_test_setparams(st);
        if (!st->cb(st->params, st->cb_arg)) {
            bytes[0] ^= 1;
            return 1;
        }
    }
    return 0;
}